

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook_test.cc
# Opt level: O0

void __thiscall
HookListTest_MultithreadedTest_Test::~HookListTest_MultithreadedTest_Test
          (HookListTest_MultithreadedTest_Test *this)

{
  HookListTest_MultithreadedTest_Test *this_local;
  
  ~HookListTest_MultithreadedTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HookListTest, MultithreadedTest) {
  ASSERT_TRUE(list.Remove(kTestValue));
  ASSERT_EQ(0, list.priv_end);

  // Run kHookListMaxValues thread, each running MultithreadedTestThread.
  // First, we need to set up the rest of the globals.
  num_threads_remaining = kHookListMaxValues;   // a global var
  RunManyThreadsWithId(&MultithreadedTestThreadRunner, num_threads_remaining);

  MallocHook::NewHook values[kHookListMaxValues + 1];
  EXPECT_EQ(0, list.Traverse(values, kHookListMaxValues + 1));
  EXPECT_EQ(0, list.priv_end);
}